

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  ImGuiContext_conflict1 *pIVar1;
  char *pcVar2;
  char *pcVar3;
  char *text_display_end;
  
  pIVar1 = GImGui;
  pcVar2 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
  text_display_end = text;
  pcVar3 = text;
  if (text < pcVar2) {
    do {
      text_display_end = pcVar3;
      if (*text_display_end == '#') {
        if (text_display_end[1] == '#') break;
      }
      else if (*text_display_end == '\0') break;
      pcVar3 = text_display_end + 1;
      text_display_end = pcVar2;
    } while (pcVar3 != pcVar2);
  }
  if (((int)text_display_end != (int)text) &&
     (RenderTextClippedEx(GImGui->CurrentWindow->DrawList,pos_min,pos_max,text,text_display_end,
                          text_size_if_known,align,clip_rect), pIVar1->LogEnabled == true)) {
    LogRenderedText(pos_min,text,text_display_end);
    return;
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    RenderTextClippedEx(window->DrawList, pos_min, pos_max, text, text_display_end, text_size_if_known, align, clip_rect);
    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_display_end);
}